

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O0

Result __thiscall
wabt::SharedValidator::OnGlobalInitExpr_RefFunc(SharedValidator *this,Location *loc,Var *func_var)

{
  Var *loc_00;
  reference pvVar1;
  Type local_80;
  Enum local_7c;
  Var local_78;
  Enum local_2c;
  Var *local_28;
  Var *func_var_local;
  Location *loc_local;
  SharedValidator *this_local;
  Result result;
  
  local_28 = func_var;
  func_var_local = (Var *)loc;
  loc_local = (Location *)this;
  Result::Result((Result *)((long)&this_local + 4),Ok);
  Var::Var(&local_78,func_var);
  local_2c = (Enum)CheckFuncIndex(this,&local_78,(FuncType *)0x0);
  Result::operator|=((Result *)((long)&this_local + 4),(Result)local_2c);
  Var::~Var(&local_78);
  std::vector<wabt::Var,_std::allocator<wabt::Var>_>::push_back(&this->init_expr_funcs_,func_var);
  loc_00 = func_var_local;
  Type::Type(&local_80,Funcref);
  pvVar1 = std::
           vector<wabt::SharedValidator::GlobalType,_std::allocator<wabt::SharedValidator::GlobalType>_>
           ::back(&this->globals_);
  local_7c = (Enum)CheckType(this,&loc_00->loc,local_80,(Type)(pvVar1->type).enum_,
                             "global initializer expression");
  Result::operator|=((Result *)((long)&this_local + 4),(Result)local_7c);
  return (Result)this_local._4_4_;
}

Assistant:

Result SharedValidator::OnGlobalInitExpr_RefFunc(const Location& loc,
                                                 Var func_var) {
  Result result = Result::Ok;
  result |= CheckFuncIndex(func_var);
  init_expr_funcs_.push_back(func_var);
  result |= CheckType(loc, Type::Funcref, globals_.back().type,
                      "global initializer expression");
  return result;
}